

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

int __thiscall
MEM_CPY<Fad<double>_>::copy(MEM_CPY<Fad<double>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Fad<double> tmp3;
  Fad<double> tmp2;
  Fad<double> tmp1;
  Fad<double> tmp0;
  int i3;
  int i2;
  int i1;
  int i;
  int Nmod4;
  Fad<double> *in_stack_ffffffffffffff48;
  Fad<double> *in_stack_ffffffffffffff50;
  Fad<double> *in_stack_ffffffffffffff60;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < (int)((uint)src & 3); local_1c = local_1c + 1) {
    Fad<double>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  for (; local_1c < (int)(uint)src; local_1c = local_1c + 4) {
    Fad<double>::Fad(in_stack_ffffffffffffff60);
    Fad<double>::Fad(in_stack_ffffffffffffff60);
    Fad<double>::Fad(in_stack_ffffffffffffff60);
    Fad<double>::Fad(in_stack_ffffffffffffff60);
    Fad<double>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Fad<double>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Fad<double>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Fad<double>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Fad<double>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Fad<double>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Fad<double>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Fad<double>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Fad<double>::~Fad(in_stack_ffffffffffffff50);
    Fad<double>::~Fad(in_stack_ffffffffffffff50);
    Fad<double>::~Fad(in_stack_ffffffffffffff50);
    Fad<double>::~Fad(in_stack_ffffffffffffff50);
  }
  return local_1c;
}

Assistant:

static void copy(T* RESTRICT dest, const T* src, const int N)
    {
      // Unwind the inner loop, four elements at a time
      int Nmod4 = N & 0x03;

      int i=0;
      for (; i< Nmod4; ++i)
	dest[i] = src[i];

      for (; i<N; i+=4)
        {
	  // Common subexpression elimination: avoid doing i+1, i+2, i+3
	  // multiple times (compilers *won't* do this cse automatically) 
	  int i1 = i+1;
	  int i2 = i+2;
	  int i3 = i+3;

	  // Reading all the results first avoids aliasing
	  // ambiguities, and provides more flexibility in
	  // register allocation & instruction scheduling
	  T tmp0,tmp1, tmp2, tmp3;
	  tmp0 = src[i];
	  tmp1 = src[i1];
	  tmp2 = src[i2];
	  tmp3 = src[i3];

	  dest[i]  = tmp0;
	  dest[i1] = tmp1;
	  dest[i2] = tmp2;
	  dest[i3] = tmp3;
        }
    }